

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unix.c
# Opt level: O0

int enet_address_set_host(ENetAddress *address,char *name)

{
  int iVar1;
  char *in_RSI;
  undefined4 *in_RDI;
  sockaddr_in *sin;
  addrinfo *result;
  addrinfo *resultList;
  addrinfo hints;
  ENetAddress *in_stack_ffffffffffffff98;
  addrinfo *local_58;
  addrinfo *local_50;
  undefined1 local_48 [4];
  undefined4 local_44;
  char *local_18;
  undefined4 *local_10;
  int local_4;
  
  local_50 = (addrinfo *)0x0;
  local_18 = in_RSI;
  local_10 = in_RDI;
  memset(local_48,0,0x30);
  local_44 = 2;
  iVar1 = getaddrinfo(local_18,(char *)0x0,(addrinfo *)0x0,&local_50);
  if (iVar1 == 0) {
    for (local_58 = local_50; local_58 != (addrinfo *)0x0; local_58 = local_58->ai_next) {
      if (((local_58->ai_family == 2) && (local_58->ai_addr != (sockaddr *)0x0)) &&
         (0xf < local_58->ai_addrlen)) {
        *local_10 = *(undefined4 *)(local_58->ai_addr->sa_data + 2);
        freeaddrinfo(local_50);
        return 0;
      }
    }
    if (local_50 != (addrinfo *)0x0) {
      freeaddrinfo(local_50);
    }
    local_4 = enet_address_set_host_ip(in_stack_ffffffffffffff98,(char *)0x10d50c);
  }
  else {
    local_4 = -1;
  }
  return local_4;
}

Assistant:

int
enet_address_set_host (ENetAddress * address, const char * name)
{
#ifdef HAS_GETADDRINFO
    struct addrinfo hints, * resultList = NULL, * result = NULL;

    memset (& hints, 0, sizeof (hints));
    hints.ai_family = AF_INET;

    if (getaddrinfo (name, NULL, NULL, & resultList) != 0)
      return -1;

    for (result = resultList; result != NULL; result = result -> ai_next)
    {
        if (result -> ai_family == AF_INET && result -> ai_addr != NULL && result -> ai_addrlen >= sizeof (struct sockaddr_in))
        {
            struct sockaddr_in * sin = (struct sockaddr_in *) result -> ai_addr;

            address -> host = sin -> sin_addr.s_addr;

            freeaddrinfo (resultList);

            return 0;
        }
    }

    if (resultList != NULL)
      freeaddrinfo (resultList);
#else
    struct hostent * hostEntry = NULL;
#ifdef HAS_GETHOSTBYNAME_R
    struct hostent hostData;
    char buffer [2048];
    int errnum;

#if defined(linux) || defined(__linux) || defined(__linux__) || defined(__FreeBSD__) || defined(__FreeBSD_kernel__) || defined(__DragonFly__) || defined(__GNU__)
    gethostbyname_r (name, & hostData, buffer, sizeof (buffer), & hostEntry, & errnum);
#else
    hostEntry = gethostbyname_r (name, & hostData, buffer, sizeof (buffer), & errnum);
#endif
#else
    hostEntry = gethostbyname (name);
#endif

    if (hostEntry != NULL && hostEntry -> h_addrtype == AF_INET)
    {
        address -> host = * (enet_uint32 *) hostEntry -> h_addr_list [0];

        return 0;
    }
#endif

    return enet_address_set_host_ip (address, name);
}